

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O1

void __thiscall avilib::AviReader::~AviReader(AviReader *this)

{
  this->_vptr_AviReader = (_func_int **)&PTR__AviReader_0013ace0;
  std::ifstream::close();
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
            (&(this->m_moviOffs).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>_>_>
  ::~_Rb_tree(&(this->odml_frameIdxs)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>_>_>
  ::~_Rb_tree(&(this->m_frameIdxs)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_avilib::_avisuperindex_chunk>,_std::_Select1st<std::pair<const_int,_avilib::_avisuperindex_chunk>_>,_std::less<int>,_std::allocator<std::pair<const_int,_avilib::_avisuperindex_chunk>_>_>
  ::~_Rb_tree(&(this->m_superIndex)._M_t);
  std::ifstream::~ifstream(&this->_f);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&(this->super_LoggingObject).m_messages);
  return;
}

Assistant:

avilib::AviReader::~AviReader()
{
	_f.close();
}